

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuilder.c
# Opt level: O3

strbuilder * strbuilder_append_string(strbuilder *builder,char *str)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (builder == (strbuilder *)0x0) {
LAB_0010f025:
    builder = (strbuilder *)0x0;
  }
  else {
    cVar1 = *str;
    if (cVar1 != '\0') {
      pcVar3 = builder->position;
      pcVar4 = str + 1;
      do {
        if (pcVar3 == builder->buffer_end) {
          sVar2 = increase_size(builder);
          if (sVar2 == 0) goto LAB_0010f025;
          cVar1 = pcVar4[-1];
          pcVar3 = builder->position;
        }
        *pcVar3 = cVar1;
        pcVar3 = builder->position + 1;
        builder->position = pcVar3;
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
    }
  }
  return builder;
}

Assistant:

struct strbuilder *
strbuilder_append_string( struct strbuilder *builder, const char *str ) {
  const char *curr;
  size_t old_size;

  if( !builder ) {
    return NULL;
  }

  curr = str;
  while ( *curr != '\0' ) {
    if( builder->position == builder->buffer_end ) {
      old_size = increase_size( builder );
      if( old_size == 0 ) {
        return NULL;
      }
    }

    *( builder->position ) = *curr;
    builder->position++;

    curr++;
  }

  return builder;
}